

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O1

Promise<void> __thiscall
capnp::_::TestExtendsImpl::grault(TestExtendsImpl *this,GraultContext context)

{
  long *in_RDX;
  undefined1 in_stack_00000040 [40];
  PointerBuilder local_88;
  undefined1 local_70;
  SegmentBuilder *local_58;
  CapTableBuilder *pCStack_50;
  WirePointer *local_48;
  StructBuilder local_40;
  
  *(int *)context.hook[1]._vptr_CallContextHook = *(int *)context.hook[1]._vptr_CallContextHook + 1;
  (**(code **)(*in_RDX + 8))();
  local_70 = 0;
  (**(code **)(*in_RDX + 0x10))(&local_58);
  local_88.pointer = local_48;
  local_88.segment = local_58;
  local_88.capTable = pCStack_50;
  PointerBuilder::getStruct(&local_40,&local_88,(StructSize)0x140006,(word *)0x0);
  initTestMessage((Builder)in_stack_00000040);
  kj::_::readyNow();
  *(SegmentBuilder **)&this->super_Server = local_88.segment;
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> TestExtendsImpl::grault(GraultContext context) {
  ++callCount;
  context.releaseParams();

  initTestMessage(context.getResults());

  return kj::READY_NOW;
}